

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWPackage.cxx
# Opt level: O0

void __thiscall cmCPackIFWPackage::GeneratePackageFile(cmCPackIFWPackage *this)

{
  bool bVar1;
  ulong uVar2;
  char *name_00;
  pointer ppVar3;
  size_type sVar4;
  reference pvVar5;
  reference ppcVar6;
  pointer pDVar7;
  reference ppDVar8;
  ostream *poVar9;
  pair<std::_Rb_tree_const_iterator<cmCPackIFWPackage::DependenceStruct>,_bool> pVar10;
  allocator local_e29;
  string local_e28;
  allocator local_e01;
  string local_e00;
  allocator local_dd9;
  string local_dd8;
  allocator local_db1;
  string local_db0;
  allocator local_d89;
  string local_d88;
  allocator local_d61;
  string local_d60;
  allocator local_d39;
  string local_d38;
  ulong local_d18;
  size_t i_5;
  string local_d08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ce8;
  undefined1 local_cc8 [8];
  string path_3;
  string name_3;
  size_t i_4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  licenses;
  allocator local_c41;
  string local_c40;
  string local_c20;
  _Self local_c00;
  string local_bf8;
  _Rb_tree_const_iterator<cmCPackIFWPackage::DependenceStruct> local_bd8;
  iterator it_4;
  ostringstream dependencies_1;
  _Self local_a48;
  _Self local_a40;
  iterator ait_1;
  set<cmCPackIFWPackage::DependenceStruct,_std::less<cmCPackIFWPackage::DependenceStruct>,_std::allocator<cmCPackIFWPackage::DependenceStruct>_>
  compAutoDepSet;
  allocator local_9e1;
  string local_9e0;
  string local_9c0;
  _Self local_9a0;
  string local_998;
  _Rb_tree_const_iterator<cmCPackIFWPackage::DependenceStruct> local_978;
  iterator it_3;
  ostringstream dependencies;
  DependenceStruct local_7e8;
  _Self local_7a0;
  _Self local_798;
  iterator it_2;
  _Self local_780;
  _Self local_778;
  iterator ait;
  set<cmCPackIFWPackage::DependenceStruct,_std::less<cmCPackIFWPackage::DependenceStruct>,_std::allocator<cmCPackIFWPackage::DependenceStruct>_>
  compDepSet;
  string local_738;
  ulong local_718;
  size_t i_3;
  string local_708;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6e8;
  undefined1 local_6c8 [8];
  string path_2;
  string name_2;
  size_t i_2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  translations;
  string local_660;
  ulong local_640;
  size_t i_1;
  string local_630;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_610;
  undefined1 local_5f0 [8];
  string path_1;
  string name_1;
  size_t i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  userInterfaces;
  string local_588;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_568;
  undefined1 local_548 [8];
  string path;
  string name;
  string local_500;
  cmTimestamp local_4d9;
  string local_4d8;
  allocator local_4b1;
  string local_4b0;
  allocator local_489;
  string local_488;
  allocator local_461;
  string local_460;
  allocator local_439;
  string local_438;
  allocator local_411;
  string local_410;
  allocator local_3e9;
  string local_3e8;
  _Self local_3c8;
  _Self local_3c0;
  iterator it_1;
  string local_3b0;
  _Self local_390;
  _Self local_388;
  iterator it;
  string local_378;
  undefined1 local_358 [8];
  cmXMLWriter xout;
  undefined1 local_2e8 [8];
  cmGeneratedFileStream fout;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  cmCPackIFWPackage *local_10;
  cmCPackIFWPackage *this_local;
  
  local_10 = this;
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) != 0) {
    if (this->Installer == (cmCPackIFWInstaller *)0x0) {
      if ((this->super_cmCPackIFWCommon).Generator != (cmCPackIFWGenerator *)0x0) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &fout.field_0x240,
                       &(((this->super_cmCPackIFWCommon).Generator)->super_cmCPackGenerator).
                        toplevel,"/packages/");
        std::operator+(&local_80,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &fout.field_0x240,&this->Name);
        std::__cxx11::string::operator=((string *)&this->Directory,(string *)&local_80);
        std::__cxx11::string::~string((string *)&local_80);
        std::__cxx11::string::~string((string *)&fout.field_0x240);
      }
    }
    else {
      std::operator+(&local_50,&this->Installer->Directory,"/packages/");
      std::operator+(&local_30,&local_50,&this->Name);
      std::__cxx11::string::operator=((string *)&this->Directory,(string *)&local_30);
      std::__cxx11::string::~string((string *)&local_30);
      std::__cxx11::string::~string((string *)&local_50);
    }
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &xout.ElementOpen,&this->Directory,"/meta/package.xml");
  name_00 = (char *)std::__cxx11::string::data();
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)local_2e8,name_00,false,None);
  std::__cxx11::string::~string((string *)&xout.ElementOpen);
  cmXMLWriter::cmXMLWriter((cmXMLWriter *)local_358,(ostream *)local_2e8,0);
  cmXMLWriter::StartDocument((cmXMLWriter *)local_358,"UTF-8");
  cmCPackIFWCommon::WriteGeneratedByToStrim(&this->super_cmCPackIFWCommon,(cmXMLWriter *)local_358);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_378,"Package",(allocator *)((long)&it._M_node + 7));
  cmXMLWriter::StartElement((cmXMLWriter *)local_358,&local_378);
  std::__cxx11::string::~string((string *)&local_378);
  std::allocator<char>::~allocator((allocator<char> *)((long)&it._M_node + 7));
  local_388._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::begin(&this->DisplayName);
  while( true ) {
    local_390._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::end(&this->DisplayName);
    bVar1 = std::operator!=(&local_388,&local_390);
    if (!bVar1) break;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_3b0,"DisplayName",(allocator *)((long)&it_1._M_node + 7));
    cmXMLWriter::StartElement((cmXMLWriter *)local_358,&local_3b0);
    std::__cxx11::string::~string((string *)&local_3b0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&it_1._M_node + 7));
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator->(&local_388);
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      ppVar3 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator->(&local_388);
      cmXMLWriter::Attribute<std::__cxx11::string>
                ((cmXMLWriter *)local_358,"xml:lang",&ppVar3->first);
    }
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&local_388);
    cmXMLWriter::Content<std::__cxx11::string>((cmXMLWriter *)local_358,&ppVar3->second);
    cmXMLWriter::EndElement((cmXMLWriter *)local_358);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator++(&local_388);
  }
  local_3c0._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::begin(&this->Description);
  while( true ) {
    local_3c8._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::end(&this->Description);
    bVar1 = std::operator!=(&local_3c0,&local_3c8);
    if (!bVar1) break;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_3e8,"Description",&local_3e9);
    cmXMLWriter::StartElement((cmXMLWriter *)local_358,&local_3e8);
    std::__cxx11::string::~string((string *)&local_3e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_3e9);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator->(&local_3c0);
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      ppVar3 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator->(&local_3c0);
      cmXMLWriter::Attribute<std::__cxx11::string>
                ((cmXMLWriter *)local_358,"xml:lang",&ppVar3->first);
    }
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&local_3c0);
    cmXMLWriter::Content<std::__cxx11::string>((cmXMLWriter *)local_358,&ppVar3->second);
    cmXMLWriter::EndElement((cmXMLWriter *)local_358);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator++(&local_3c0);
  }
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_410,"UpdateText",&local_411);
    cmXMLWriter::Element<std::__cxx11::string>
              ((cmXMLWriter *)local_358,&local_410,&this->UpdateText);
    std::__cxx11::string::~string((string *)&local_410);
    std::allocator<char>::~allocator((allocator<char> *)&local_411);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_438,"Name",&local_439);
  cmXMLWriter::Element<std::__cxx11::string>((cmXMLWriter *)local_358,&local_438,&this->Name);
  std::__cxx11::string::~string((string *)&local_438);
  std::allocator<char>::~allocator((allocator<char> *)&local_439);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_460,"Version",&local_461);
  cmXMLWriter::Element<std::__cxx11::string>((cmXMLWriter *)local_358,&local_460,&this->Version);
  std::__cxx11::string::~string((string *)&local_460);
  std::allocator<char>::~allocator((allocator<char> *)&local_461);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_488,"ReleaseDate",&local_489);
    cmXMLWriter::Element<std::__cxx11::string>
              ((cmXMLWriter *)local_358,&local_488,&this->ReleaseDate);
    std::__cxx11::string::~string((string *)&local_488);
    std::allocator<char>::~allocator((allocator<char> *)&local_489);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_4b0,"ReleaseDate",&local_4b1);
    cmTimestamp::cmTimestamp(&local_4d9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_500,"%Y-%m-%d",(allocator *)(name.field_2._M_local_buf + 0xf));
    cmTimestamp::CurrentTime(&local_4d8,&local_4d9,&local_500,true);
    cmXMLWriter::Element<std::__cxx11::string>((cmXMLWriter *)local_358,&local_4b0,&local_4d8);
    std::__cxx11::string::~string((string *)&local_4d8);
    std::__cxx11::string::~string((string *)&local_500);
    std::allocator<char>::~allocator((allocator<char> *)(name.field_2._M_local_buf + 0xf));
    std::__cxx11::string::~string((string *)&local_4b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_4b1);
  }
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    cmsys::SystemTools::GetFilenameName((string *)((long)&path.field_2 + 8),&this->Script);
    std::operator+(&local_568,&this->Directory,"/meta/");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_548,
                   &local_568,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&path.field_2 + 8));
    std::__cxx11::string::~string((string *)&local_568);
    cmsys::SystemTools::CopyFileIfDifferent(&this->Script,(string *)local_548);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_588,"Script",
               (allocator *)
               ((long)&userInterfaces.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    cmXMLWriter::Element<std::__cxx11::string>
              ((cmXMLWriter *)local_358,&local_588,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&path.field_2 + 8));
    std::__cxx11::string::~string((string *)&local_588);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&userInterfaces.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    std::__cxx11::string::~string((string *)local_548);
    std::__cxx11::string::~string((string *)(path.field_2._M_local_buf + 8));
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&i,&this->UserInterfaces);
  for (name_1.field_2._8_8_ = 0;
      sVar4 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&i), (ulong)name_1.field_2._8_8_ < sVar4;
      name_1.field_2._8_8_ = name_1.field_2._8_8_ + 1) {
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&i,name_1.field_2._8_8_);
    cmsys::SystemTools::GetFilenameName((string *)((long)&path_1.field_2 + 8),pvVar5);
    std::operator+(&local_610,&this->Directory,"/meta/");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5f0,
                   &local_610,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&path_1.field_2 + 8));
    std::__cxx11::string::~string((string *)&local_610);
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&i,name_1.field_2._8_8_);
    cmsys::SystemTools::CopyFileIfDifferent(pvVar5,(string *)local_5f0);
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&i,name_1.field_2._8_8_);
    std::__cxx11::string::operator=((string *)pvVar5,(string *)(path_1.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_5f0);
    std::__cxx11::string::~string((string *)(path_1.field_2._M_local_buf + 8));
  }
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&i);
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_630,"UserInterfaces",(allocator *)((long)&i_1 + 7));
    cmXMLWriter::StartElement((cmXMLWriter *)local_358,&local_630);
    std::__cxx11::string::~string((string *)&local_630);
    std::allocator<char>::~allocator((allocator<char> *)((long)&i_1 + 7));
    for (local_640 = 0; uVar2 = local_640,
        sVar4 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&i), uVar2 < sVar4; local_640 = local_640 + 1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_660,"UserInterface",
                 (allocator *)
                 ((long)&translations.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&i,local_640);
      cmXMLWriter::Element<std::__cxx11::string>((cmXMLWriter *)local_358,&local_660,pvVar5);
      std::__cxx11::string::~string((string *)&local_660);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&translations.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    }
    cmXMLWriter::EndElement((cmXMLWriter *)local_358);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&i_2,&this->Translations);
  for (name_2.field_2._8_8_ = 0;
      sVar4 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&i_2), (ulong)name_2.field_2._8_8_ < sVar4;
      name_2.field_2._8_8_ = name_2.field_2._8_8_ + 1) {
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&i_2,name_2.field_2._8_8_);
    cmsys::SystemTools::GetFilenameName((string *)((long)&path_2.field_2 + 8),pvVar5);
    std::operator+(&local_6e8,&this->Directory,"/meta/");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6c8,
                   &local_6e8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&path_2.field_2 + 8));
    std::__cxx11::string::~string((string *)&local_6e8);
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&i_2,name_2.field_2._8_8_);
    cmsys::SystemTools::CopyFileIfDifferent(pvVar5,(string *)local_6c8);
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&i_2,name_2.field_2._8_8_);
    std::__cxx11::string::operator=((string *)pvVar5,(string *)(path_2.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_6c8);
    std::__cxx11::string::~string((string *)(path_2.field_2._M_local_buf + 8));
  }
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&i_2);
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_708,"Translations",(allocator *)((long)&i_3 + 7));
    cmXMLWriter::StartElement((cmXMLWriter *)local_358,&local_708);
    std::__cxx11::string::~string((string *)&local_708);
    std::allocator<char>::~allocator((allocator<char> *)((long)&i_3 + 7));
    for (local_718 = 0; uVar2 = local_718,
        sVar4 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&i_2), uVar2 < sVar4; local_718 = local_718 + 1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_738,"Translation",
                 (allocator *)
                 ((long)&compDepSet._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&i_2,local_718);
      cmXMLWriter::Element<std::__cxx11::string>((cmXMLWriter *)local_358,&local_738,pvVar5);
      std::__cxx11::string::~string((string *)&local_738);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&compDepSet._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
    }
    cmXMLWriter::EndElement((cmXMLWriter *)local_358);
  }
  std::
  set<cmCPackIFWPackage::DependenceStruct,_std::less<cmCPackIFWPackage::DependenceStruct>,_std::allocator<cmCPackIFWPackage::DependenceStruct>_>
  ::set((set<cmCPackIFWPackage::DependenceStruct,_std::less<cmCPackIFWPackage::DependenceStruct>,_std::allocator<cmCPackIFWPackage::DependenceStruct>_>
         *)&ait);
  local_778._M_node =
       (_Base_ptr)
       std::
       set<cmCPackIFWPackage::DependenceStruct_*,_std::less<cmCPackIFWPackage::DependenceStruct_*>,_std::allocator<cmCPackIFWPackage::DependenceStruct_*>_>
       ::begin(&this->AlienDependencies);
  while( true ) {
    local_780._M_node =
         (_Base_ptr)
         std::
         set<cmCPackIFWPackage::DependenceStruct_*,_std::less<cmCPackIFWPackage::DependenceStruct_*>,_std::allocator<cmCPackIFWPackage::DependenceStruct_*>_>
         ::end(&this->AlienDependencies);
    bVar1 = std::operator!=(&local_778,&local_780);
    if (!bVar1) break;
    ppDVar8 = std::_Rb_tree_const_iterator<cmCPackIFWPackage::DependenceStruct_*>::operator*
                        (&local_778);
    pVar10 = std::
             set<cmCPackIFWPackage::DependenceStruct,_std::less<cmCPackIFWPackage::DependenceStruct>,_std::allocator<cmCPackIFWPackage::DependenceStruct>_>
             ::insert((set<cmCPackIFWPackage::DependenceStruct,_std::less<cmCPackIFWPackage::DependenceStruct>,_std::allocator<cmCPackIFWPackage::DependenceStruct>_>
                       *)&ait,*ppDVar8);
    it_2._M_node = (_Base_ptr)pVar10.first._M_node;
    std::_Rb_tree_const_iterator<cmCPackIFWPackage::DependenceStruct_*>::operator++(&local_778);
  }
  local_798._M_node =
       (_Base_ptr)
       std::
       set<cmCPackIFWPackage_*,_std::less<cmCPackIFWPackage_*>,_std::allocator<cmCPackIFWPackage_*>_>
       ::begin(&this->Dependencies);
  while( true ) {
    local_7a0._M_node =
         (_Base_ptr)
         std::
         set<cmCPackIFWPackage_*,_std::less<cmCPackIFWPackage_*>,_std::allocator<cmCPackIFWPackage_*>_>
         ::end(&this->Dependencies);
    bVar1 = std::operator!=(&local_798,&local_7a0);
    if (!bVar1) break;
    ppcVar6 = std::_Rb_tree_const_iterator<cmCPackIFWPackage_*>::operator*(&local_798);
    DependenceStruct::DependenceStruct(&local_7e8,&(*ppcVar6)->Name);
    std::
    set<cmCPackIFWPackage::DependenceStruct,_std::less<cmCPackIFWPackage::DependenceStruct>,_std::allocator<cmCPackIFWPackage::DependenceStruct>_>
    ::insert((set<cmCPackIFWPackage::DependenceStruct,_std::less<cmCPackIFWPackage::DependenceStruct>,_std::allocator<cmCPackIFWPackage::DependenceStruct>_>
              *)&ait,&local_7e8);
    DependenceStruct::~DependenceStruct(&local_7e8);
    std::_Rb_tree_const_iterator<cmCPackIFWPackage_*>::operator++(&local_798);
  }
  bVar1 = std::
          set<cmCPackIFWPackage::DependenceStruct,_std::less<cmCPackIFWPackage::DependenceStruct>,_std::allocator<cmCPackIFWPackage::DependenceStruct>_>
          ::empty((set<cmCPackIFWPackage::DependenceStruct,_std::less<cmCPackIFWPackage::DependenceStruct>,_std::allocator<cmCPackIFWPackage::DependenceStruct>_>
                   *)&ait);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&it_3);
    local_978._M_node =
         (_Base_ptr)
         std::
         set<cmCPackIFWPackage::DependenceStruct,_std::less<cmCPackIFWPackage::DependenceStruct>,_std::allocator<cmCPackIFWPackage::DependenceStruct>_>
         ::begin((set<cmCPackIFWPackage::DependenceStruct,_std::less<cmCPackIFWPackage::DependenceStruct>,_std::allocator<cmCPackIFWPackage::DependenceStruct>_>
                  *)&ait);
    pDVar7 = std::_Rb_tree_const_iterator<cmCPackIFWPackage::DependenceStruct>::operator->
                       (&local_978);
    DependenceStruct::NameWithCompare_abi_cxx11_(&local_998,pDVar7);
    std::operator<<((ostream *)&it_3,(string *)&local_998);
    std::__cxx11::string::~string((string *)&local_998);
    std::_Rb_tree_const_iterator<cmCPackIFWPackage::DependenceStruct>::operator++(&local_978);
    while( true ) {
      local_9a0._M_node =
           (_Base_ptr)
           std::
           set<cmCPackIFWPackage::DependenceStruct,_std::less<cmCPackIFWPackage::DependenceStruct>,_std::allocator<cmCPackIFWPackage::DependenceStruct>_>
           ::end((set<cmCPackIFWPackage::DependenceStruct,_std::less<cmCPackIFWPackage::DependenceStruct>,_std::allocator<cmCPackIFWPackage::DependenceStruct>_>
                  *)&ait);
      bVar1 = std::operator!=(&local_978,&local_9a0);
      if (!bVar1) break;
      poVar9 = std::operator<<((ostream *)&it_3,",");
      pDVar7 = std::_Rb_tree_const_iterator<cmCPackIFWPackage::DependenceStruct>::operator->
                         (&local_978);
      DependenceStruct::NameWithCompare_abi_cxx11_(&local_9c0,pDVar7);
      std::operator<<(poVar9,(string *)&local_9c0);
      std::__cxx11::string::~string((string *)&local_9c0);
      std::_Rb_tree_const_iterator<cmCPackIFWPackage::DependenceStruct>::operator++(&local_978);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_9e0,"Dependencies",&local_9e1);
    std::__cxx11::ostringstream::str();
    cmXMLWriter::Element<std::__cxx11::string>
              ((cmXMLWriter *)local_358,&local_9e0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &compAutoDepSet._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::__cxx11::string::~string
              ((string *)&compAutoDepSet._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::__cxx11::string::~string((string *)&local_9e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_9e1);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&it_3);
  }
  std::
  set<cmCPackIFWPackage::DependenceStruct,_std::less<cmCPackIFWPackage::DependenceStruct>,_std::allocator<cmCPackIFWPackage::DependenceStruct>_>
  ::set((set<cmCPackIFWPackage::DependenceStruct,_std::less<cmCPackIFWPackage::DependenceStruct>,_std::allocator<cmCPackIFWPackage::DependenceStruct>_>
         *)&ait_1);
  local_a40._M_node =
       (_Base_ptr)
       std::
       set<cmCPackIFWPackage::DependenceStruct_*,_std::less<cmCPackIFWPackage::DependenceStruct_*>,_std::allocator<cmCPackIFWPackage::DependenceStruct_*>_>
       ::begin(&this->AlienAutoDependOn);
  while( true ) {
    local_a48._M_node =
         (_Base_ptr)
         std::
         set<cmCPackIFWPackage::DependenceStruct_*,_std::less<cmCPackIFWPackage::DependenceStruct_*>,_std::allocator<cmCPackIFWPackage::DependenceStruct_*>_>
         ::end(&this->AlienAutoDependOn);
    bVar1 = std::operator!=(&local_a40,&local_a48);
    if (!bVar1) break;
    ppDVar8 = std::_Rb_tree_const_iterator<cmCPackIFWPackage::DependenceStruct_*>::operator*
                        (&local_a40);
    std::
    set<cmCPackIFWPackage::DependenceStruct,_std::less<cmCPackIFWPackage::DependenceStruct>,_std::allocator<cmCPackIFWPackage::DependenceStruct>_>
    ::insert((set<cmCPackIFWPackage::DependenceStruct,_std::less<cmCPackIFWPackage::DependenceStruct>,_std::allocator<cmCPackIFWPackage::DependenceStruct>_>
              *)&ait_1,*ppDVar8);
    std::_Rb_tree_const_iterator<cmCPackIFWPackage::DependenceStruct_*>::operator++(&local_a40);
  }
  bVar1 = std::
          set<cmCPackIFWPackage::DependenceStruct,_std::less<cmCPackIFWPackage::DependenceStruct>,_std::allocator<cmCPackIFWPackage::DependenceStruct>_>
          ::empty((set<cmCPackIFWPackage::DependenceStruct,_std::less<cmCPackIFWPackage::DependenceStruct>,_std::allocator<cmCPackIFWPackage::DependenceStruct>_>
                   *)&ait_1);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&it_4);
    local_bd8._M_node =
         (_Base_ptr)
         std::
         set<cmCPackIFWPackage::DependenceStruct,_std::less<cmCPackIFWPackage::DependenceStruct>,_std::allocator<cmCPackIFWPackage::DependenceStruct>_>
         ::begin((set<cmCPackIFWPackage::DependenceStruct,_std::less<cmCPackIFWPackage::DependenceStruct>,_std::allocator<cmCPackIFWPackage::DependenceStruct>_>
                  *)&ait_1);
    pDVar7 = std::_Rb_tree_const_iterator<cmCPackIFWPackage::DependenceStruct>::operator->
                       (&local_bd8);
    DependenceStruct::NameWithCompare_abi_cxx11_(&local_bf8,pDVar7);
    std::operator<<((ostream *)&it_4,(string *)&local_bf8);
    std::__cxx11::string::~string((string *)&local_bf8);
    std::_Rb_tree_const_iterator<cmCPackIFWPackage::DependenceStruct>::operator++(&local_bd8);
    while( true ) {
      local_c00._M_node =
           (_Base_ptr)
           std::
           set<cmCPackIFWPackage::DependenceStruct,_std::less<cmCPackIFWPackage::DependenceStruct>,_std::allocator<cmCPackIFWPackage::DependenceStruct>_>
           ::end((set<cmCPackIFWPackage::DependenceStruct,_std::less<cmCPackIFWPackage::DependenceStruct>,_std::allocator<cmCPackIFWPackage::DependenceStruct>_>
                  *)&ait_1);
      bVar1 = std::operator!=(&local_bd8,&local_c00);
      if (!bVar1) break;
      poVar9 = std::operator<<((ostream *)&it_4,",");
      pDVar7 = std::_Rb_tree_const_iterator<cmCPackIFWPackage::DependenceStruct>::operator->
                         (&local_bd8);
      DependenceStruct::NameWithCompare_abi_cxx11_(&local_c20,pDVar7);
      std::operator<<(poVar9,(string *)&local_c20);
      std::__cxx11::string::~string((string *)&local_c20);
      std::_Rb_tree_const_iterator<cmCPackIFWPackage::DependenceStruct>::operator++(&local_bd8);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_c40,"AutoDependOn",&local_c41);
    std::__cxx11::ostringstream::str();
    cmXMLWriter::Element<std::__cxx11::string>
              ((cmXMLWriter *)local_358,&local_c40,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &licenses.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string
              ((string *)
               &licenses.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string((string *)&local_c40);
    std::allocator<char>::~allocator((allocator<char> *)&local_c41);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&it_4);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&i_4,&this->Licenses);
  for (name_3.field_2._8_8_ = 1;
      sVar4 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&i_4), (ulong)name_3.field_2._8_8_ < sVar4;
      name_3.field_2._8_8_ = name_3.field_2._8_8_ + 2) {
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&i_4,name_3.field_2._8_8_);
    cmsys::SystemTools::GetFilenameName((string *)((long)&path_3.field_2 + 8),pvVar5);
    std::operator+(&local_ce8,&this->Directory,"/meta/");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_cc8,
                   &local_ce8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&path_3.field_2 + 8));
    std::__cxx11::string::~string((string *)&local_ce8);
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&i_4,name_3.field_2._8_8_);
    cmsys::SystemTools::CopyFileIfDifferent(pvVar5,(string *)local_cc8);
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&i_4,name_3.field_2._8_8_);
    std::__cxx11::string::operator=((string *)pvVar5,(string *)(path_3.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_cc8);
    std::__cxx11::string::~string((string *)(path_3.field_2._M_local_buf + 8));
  }
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&i_4);
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_d08,"Licenses",(allocator *)((long)&i_5 + 7));
    cmXMLWriter::StartElement((cmXMLWriter *)local_358,&local_d08);
    std::__cxx11::string::~string((string *)&local_d08);
    std::allocator<char>::~allocator((allocator<char> *)((long)&i_5 + 7));
    for (local_d18 = 0; uVar2 = local_d18,
        sVar4 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&i_4), uVar2 < sVar4; local_d18 = local_d18 + 2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_d38,"License",&local_d39);
      cmXMLWriter::StartElement((cmXMLWriter *)local_358,&local_d38);
      std::__cxx11::string::~string((string *)&local_d38);
      std::allocator<char>::~allocator((allocator<char> *)&local_d39);
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&i_4,local_d18);
      cmXMLWriter::Attribute<std::__cxx11::string>((cmXMLWriter *)local_358,"name",pvVar5);
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&i_4,local_d18 + 1);
      cmXMLWriter::Attribute<std::__cxx11::string>((cmXMLWriter *)local_358,"file",pvVar5);
      cmXMLWriter::EndElement((cmXMLWriter *)local_358);
    }
    cmXMLWriter::EndElement((cmXMLWriter *)local_358);
  }
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_d60,"ForcedInstallation",&local_d61);
    cmXMLWriter::Element<std::__cxx11::string>
              ((cmXMLWriter *)local_358,&local_d60,&this->ForcedInstallation);
    std::__cxx11::string::~string((string *)&local_d60);
    std::allocator<char>::~allocator((allocator<char> *)&local_d61);
  }
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_d88,"RequiresAdminRights",&local_d89);
    cmXMLWriter::Element<std::__cxx11::string>
              ((cmXMLWriter *)local_358,&local_d88,&this->RequiresAdminRights);
    std::__cxx11::string::~string((string *)&local_d88);
    std::allocator<char>::~allocator((allocator<char> *)&local_d89);
  }
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_db0,"Virtual",&local_db1);
    cmXMLWriter::Element<std::__cxx11::string>((cmXMLWriter *)local_358,&local_db0,&this->Virtual);
    std::__cxx11::string::~string((string *)&local_db0);
    std::allocator<char>::~allocator((allocator<char> *)&local_db1);
  }
  else {
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_dd8,"Default",&local_dd9);
      cmXMLWriter::Element<std::__cxx11::string>((cmXMLWriter *)local_358,&local_dd8,&this->Default)
      ;
      std::__cxx11::string::~string((string *)&local_dd8);
      std::allocator<char>::~allocator((allocator<char> *)&local_dd9);
    }
  }
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_e00,"Essential",&local_e01);
    cmXMLWriter::Element<std::__cxx11::string>((cmXMLWriter *)local_358,&local_e00,&this->Essential)
    ;
    std::__cxx11::string::~string((string *)&local_e00);
    std::allocator<char>::~allocator((allocator<char> *)&local_e01);
  }
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_e28,"SortingPriority",&local_e29);
    cmXMLWriter::Element<std::__cxx11::string>
              ((cmXMLWriter *)local_358,&local_e28,&this->SortingPriority);
    std::__cxx11::string::~string((string *)&local_e28);
    std::allocator<char>::~allocator((allocator<char> *)&local_e29);
  }
  cmXMLWriter::EndElement((cmXMLWriter *)local_358);
  cmXMLWriter::EndDocument((cmXMLWriter *)local_358);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&i_4);
  std::
  set<cmCPackIFWPackage::DependenceStruct,_std::less<cmCPackIFWPackage::DependenceStruct>,_std::allocator<cmCPackIFWPackage::DependenceStruct>_>
  ::~set((set<cmCPackIFWPackage::DependenceStruct,_std::less<cmCPackIFWPackage::DependenceStruct>,_std::allocator<cmCPackIFWPackage::DependenceStruct>_>
          *)&ait_1);
  std::
  set<cmCPackIFWPackage::DependenceStruct,_std::less<cmCPackIFWPackage::DependenceStruct>,_std::allocator<cmCPackIFWPackage::DependenceStruct>_>
  ::~set((set<cmCPackIFWPackage::DependenceStruct,_std::less<cmCPackIFWPackage::DependenceStruct>,_std::allocator<cmCPackIFWPackage::DependenceStruct>_>
          *)&ait);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&i_2);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&i);
  cmXMLWriter::~cmXMLWriter((cmXMLWriter *)local_358);
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_2e8);
  return;
}

Assistant:

void cmCPackIFWPackage::GeneratePackageFile()
{
  // Lazy directory initialization
  if (this->Directory.empty()) {
    if (this->Installer) {
      this->Directory = this->Installer->Directory + "/packages/" + this->Name;
    } else if (this->Generator) {
      this->Directory = this->Generator->toplevel + "/packages/" + this->Name;
    }
  }

  // Output stream
  cmGeneratedFileStream fout((this->Directory + "/meta/package.xml").data());
  cmXMLWriter xout(fout);

  xout.StartDocument();

  WriteGeneratedByToStrim(xout);

  xout.StartElement("Package");

  // DisplayName (with translations)
  for (std::map<std::string, std::string>::iterator it =
         this->DisplayName.begin();
       it != this->DisplayName.end(); ++it) {
    xout.StartElement("DisplayName");
    if (!it->first.empty()) {
      xout.Attribute("xml:lang", it->first);
    }
    xout.Content(it->second);
    xout.EndElement();
  }

  // Description (with translations)
  for (std::map<std::string, std::string>::iterator it =
         this->Description.begin();
       it != this->Description.end(); ++it) {
    xout.StartElement("Description");
    if (!it->first.empty()) {
      xout.Attribute("xml:lang", it->first);
    }
    xout.Content(it->second);
    xout.EndElement();
  }

  // Update text
  if (!this->UpdateText.empty()) {
    xout.Element("UpdateText", this->UpdateText);
  }

  xout.Element("Name", this->Name);
  xout.Element("Version", this->Version);

  if (!this->ReleaseDate.empty()) {
    xout.Element("ReleaseDate", this->ReleaseDate);
  } else {
    xout.Element("ReleaseDate", cmTimestamp().CurrentTime("%Y-%m-%d", true));
  }

  // Script (copy to meta dir)
  if (!this->Script.empty()) {
    std::string name = cmSystemTools::GetFilenameName(this->Script);
    std::string path = this->Directory + "/meta/" + name;
    cmsys::SystemTools::CopyFileIfDifferent(this->Script, path);
    xout.Element("Script", name);
  }

  // User Interfaces (copy to meta dir)
  std::vector<std::string> userInterfaces = UserInterfaces;
  for (size_t i = 0; i < userInterfaces.size(); i++) {
    std::string name = cmSystemTools::GetFilenameName(userInterfaces[i]);
    std::string path = this->Directory + "/meta/" + name;
    cmsys::SystemTools::CopyFileIfDifferent(userInterfaces[i], path);
    userInterfaces[i] = name;
  }
  if (!userInterfaces.empty()) {
    xout.StartElement("UserInterfaces");
    for (size_t i = 0; i < userInterfaces.size(); i++) {
      xout.Element("UserInterface", userInterfaces[i]);
    }
    xout.EndElement();
  }

  // Translations (copy to meta dir)
  std::vector<std::string> translations = Translations;
  for (size_t i = 0; i < translations.size(); i++) {
    std::string name = cmSystemTools::GetFilenameName(translations[i]);
    std::string path = this->Directory + "/meta/" + name;
    cmsys::SystemTools::CopyFileIfDifferent(translations[i], path);
    translations[i] = name;
  }
  if (!translations.empty()) {
    xout.StartElement("Translations");
    for (size_t i = 0; i < translations.size(); i++) {
      xout.Element("Translation", translations[i]);
    }
    xout.EndElement();
  }

  // Dependencies
  std::set<DependenceStruct> compDepSet;
  for (std::set<DependenceStruct*>::iterator ait =
         this->AlienDependencies.begin();
       ait != this->AlienDependencies.end(); ++ait) {
    compDepSet.insert(*(*ait));
  }
  for (std::set<cmCPackIFWPackage*>::iterator it = this->Dependencies.begin();
       it != this->Dependencies.end(); ++it) {
    compDepSet.insert(DependenceStruct((*it)->Name));
  }
  // Write dependencies
  if (!compDepSet.empty()) {
    std::ostringstream dependencies;
    std::set<DependenceStruct>::iterator it = compDepSet.begin();
    dependencies << it->NameWithCompare();
    ++it;
    while (it != compDepSet.end()) {
      dependencies << "," << it->NameWithCompare();
      ++it;
    }
    xout.Element("Dependencies", dependencies.str());
  }

  // Automatic dependency on
  std::set<DependenceStruct> compAutoDepSet;
  for (std::set<DependenceStruct*>::iterator ait =
         this->AlienAutoDependOn.begin();
       ait != this->AlienAutoDependOn.end(); ++ait) {
    compAutoDepSet.insert(*(*ait));
  }
  // Write automatic dependency on
  if (!compAutoDepSet.empty()) {
    std::ostringstream dependencies;
    std::set<DependenceStruct>::iterator it = compAutoDepSet.begin();
    dependencies << it->NameWithCompare();
    ++it;
    while (it != compAutoDepSet.end()) {
      dependencies << "," << it->NameWithCompare();
      ++it;
    }
    xout.Element("AutoDependOn", dependencies.str());
  }

  // Licenses (copy to meta dir)
  std::vector<std::string> licenses = this->Licenses;
  for (size_t i = 1; i < licenses.size(); i += 2) {
    std::string name = cmSystemTools::GetFilenameName(licenses[i]);
    std::string path = this->Directory + "/meta/" + name;
    cmsys::SystemTools::CopyFileIfDifferent(licenses[i], path);
    licenses[i] = name;
  }
  if (!licenses.empty()) {
    xout.StartElement("Licenses");
    for (size_t i = 0; i < licenses.size(); i += 2) {
      xout.StartElement("License");
      xout.Attribute("name", licenses[i]);
      xout.Attribute("file", licenses[i + 1]);
      xout.EndElement();
    }
    xout.EndElement();
  }

  if (!this->ForcedInstallation.empty()) {
    xout.Element("ForcedInstallation", this->ForcedInstallation);
  }

  if (!this->RequiresAdminRights.empty()) {
    xout.Element("RequiresAdminRights", this->RequiresAdminRights);
  }

  if (!this->Virtual.empty()) {
    xout.Element("Virtual", this->Virtual);
  } else if (!this->Default.empty()) {
    xout.Element("Default", this->Default);
  }

  // Essential
  if (!this->Essential.empty()) {
    xout.Element("Essential", this->Essential);
  }

  // Priority
  if (!this->SortingPriority.empty()) {
    xout.Element("SortingPriority", this->SortingPriority);
  }

  xout.EndElement();
  xout.EndDocument();
}